

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_signal.cpp
# Opt level: O0

void tst_signal_onDestruction(void)

{
  ostream *poVar1;
  socklen_t in_ECX;
  undefined1 local_20 [8];
  OnSignalIncrement increment;
  Node *node;
  
  increment._8_8_ = rengine::Node::create();
  OnSignalIncrement::OnSignalIncrement((OnSignalIncrement *)local_20);
  rengine::Signal<>::connect
            (&rengine::SignalEmitter::onDestruction,increment.value,(sockaddr *)local_20,in_ECX);
  if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(int)increment.super_SignalHandler<>._vptr_SignalHandler);
    poVar1 = std::operator<<(poVar1,"\' vs \'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
    poVar1 = std::operator<<(poVar1,"\'");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 0) {
      __assert_fail("(increment.value) == (0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x68,"void tst_signal_onDestruction()");
    }
  }
  (**(code **)(*(long *)increment._8_8_ + 0x10))();
  if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Not equal \'");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(int)increment.super_SignalHandler<>._vptr_SignalHandler);
    poVar1 = std::operator<<(poVar1,"\' vs \'");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
    poVar1 = std::operator<<(poVar1,"\'");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    if ((int)increment.super_SignalHandler<>._vptr_SignalHandler != 1) {
      __assert_fail("(increment.value) == (1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/tst_signal.cpp"
                    ,0x6a,"void tst_signal_onDestruction()");
    }
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"void tst_signal_onDestruction()");
  poVar1 = std::operator<<(poVar1,": ok");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  OnSignalIncrement::~OnSignalIncrement((OnSignalIncrement *)local_20);
  return;
}

Assistant:

void tst_signal_onDestruction()
{
    Node *node = Node::create();

    OnSignalIncrement increment;
    SignalEmitter::onDestruction.connect(node, &increment);

    check_equal(increment.value, 0);
    node->destroy();
    check_equal(increment.value, 1);

    cout << __PRETTY_FUNCTION__ << ": ok" << endl;
}